

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

secp256k1_bulletproof_generators *
secp256k1_bulletproof_generators_create
          (secp256k1_context *ctx,secp256k1_generator *blinding_gen,size_t n)

{
  int iVar1;
  secp256k1_bulletproof_generators *__ptr;
  secp256k1_ge *psVar2;
  size_t extraout_RDX;
  size_t outlen;
  size_t extraout_RDX_00;
  long lVar3;
  bool bVar4;
  uchar tmp [32];
  uchar seed [64];
  secp256k1_rfc6979_hmac_sha256 rng;
  secp256k1_generator gen;
  
  if (blinding_gen == (secp256k1_generator *)0x0) {
    (*(ctx->illegal_callback).fn)("blinding_gen != NULL",(ctx->illegal_callback).data);
  }
  else {
    __ptr = (secp256k1_bulletproof_generators *)checked_malloc(&ctx->error_callback,0x18);
    if (__ptr != (secp256k1_bulletproof_generators *)0x0) {
      psVar2 = (secp256k1_ge *)checked_malloc(&ctx->error_callback,n * 0x58 + 0x58);
      __ptr->gens = psVar2;
      if (psVar2 != (secp256k1_ge *)0x0) {
        __ptr->blinding_gen = psVar2 + n;
        __ptr->n = n;
        secp256k1_fe_get_b32(seed,&secp256k1_ge_const_g.x);
        secp256k1_fe_get_b32(seed + 0x20,&secp256k1_ge_const_g.y);
        secp256k1_rfc6979_hmac_sha256_initialize(&rng,seed,0x40);
        lVar3 = 0;
        outlen = extraout_RDX;
        while( true ) {
          bVar4 = n == 0;
          n = n - 1;
          if (bVar4) {
            secp256k1_generator_load(__ptr->blinding_gen,blinding_gen);
            return __ptr;
          }
          tmp[0x10] = '\0';
          tmp[0x11] = '\0';
          tmp[0x12] = '\0';
          tmp[0x13] = '\0';
          tmp[0x14] = '\0';
          tmp[0x15] = '\0';
          tmp[0x16] = '\0';
          tmp[0x17] = '\0';
          tmp[0x18] = '\0';
          tmp[0x19] = '\0';
          tmp[0x1a] = '\0';
          tmp[0x1b] = '\0';
          tmp[0x1c] = '\0';
          tmp[0x1d] = '\0';
          tmp[0x1e] = '\0';
          tmp[0x1f] = '\0';
          tmp[0] = '\0';
          tmp[1] = '\0';
          tmp[2] = '\0';
          tmp[3] = '\0';
          tmp[4] = '\0';
          tmp[5] = '\0';
          tmp[6] = '\0';
          tmp[7] = '\0';
          tmp[8] = '\0';
          tmp[9] = '\0';
          tmp[10] = '\0';
          tmp[0xb] = '\0';
          tmp[0xc] = '\0';
          tmp[0xd] = '\0';
          tmp[0xe] = '\0';
          tmp[0xf] = '\0';
          secp256k1_rfc6979_hmac_sha256_generate(&rng,tmp,outlen);
          iVar1 = secp256k1_generator_generate(ctx,&gen,tmp);
          if (iVar1 == 0) break;
          secp256k1_generator_load((secp256k1_ge *)((long)(__ptr->gens->x).n + lVar3),&gen);
          lVar3 = lVar3 + 0x58;
          outlen = extraout_RDX_00;
        }
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tangramproject[P]secp256k1-zkp/src/modules/bulletproofs/main_impl.h"
                ,0x3c,"test condition failed: secp256k1_generator_generate(ctx, &gen, tmp)");
        abort();
      }
      free(__ptr);
    }
  }
  return (secp256k1_bulletproof_generators *)0x0;
}

Assistant:

secp256k1_bulletproof_generators *secp256k1_bulletproof_generators_create(const secp256k1_context *ctx, const secp256k1_generator *blinding_gen, size_t n) {
    secp256k1_bulletproof_generators *ret;
    secp256k1_rfc6979_hmac_sha256 rng;
    unsigned char seed[64];
    secp256k1_gej precompj;
    size_t i;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(blinding_gen != NULL);

    ret = (secp256k1_bulletproof_generators *)checked_malloc(&ctx->error_callback, sizeof(*ret));
    if (ret == NULL) {
        return NULL;
    }
    ret->gens = (secp256k1_ge *)checked_malloc(&ctx->error_callback, (n + 1) * sizeof(*ret->gens));
    if (ret->gens == NULL) {
        free(ret);
        return NULL;
    }
    ret->blinding_gen = &ret->gens[n];
    ret->n = n;

    secp256k1_fe_get_b32(&seed[0], &secp256k1_ge_const_g.x);
    secp256k1_fe_get_b32(&seed[32], &secp256k1_ge_const_g.y);

    secp256k1_rfc6979_hmac_sha256_initialize(&rng, seed, 64);
    for (i = 0; i < n; i++) {
        unsigned char tmp[32] = { 0 };
        secp256k1_generator gen;
        secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
        CHECK(secp256k1_generator_generate(ctx, &gen, tmp));
        secp256k1_generator_load(&ret->gens[i], &gen);

        secp256k1_gej_set_ge(&precompj, &ret->gens[i]);
    }

    secp256k1_generator_load(&ret->blinding_gen[0], blinding_gen);
    secp256k1_gej_set_ge(&precompj, &ret->blinding_gen[0]);

    return ret;
}